

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_behaviour_skip_list.c
# Opt level: O0

void runalltests_behaviour_skip_list(void)

{
  bhdct_run_tests(sldict_init,7,0xffffffff);
  return;
}

Assistant:

void
runalltests_behaviour_skip_list(
	void
) {
#if defined(ARDUINO)
	fdeleteall();
	bhdct_run_tests(sldict_init, 7, ION_BHDCT_ALL_TESTS & ~ION_BHDCT_STRING_INT);
#else
	bhdct_run_tests(sldict_init, 7, ION_BHDCT_ALL_TESTS);
#endif
}